

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Const::set_value(Const *this,string *new_value)

{
  initializer_list<const_kratos::IRNode_*> __l;
  long lVar1;
  VarException *this_00;
  int64_t iVar2;
  int64_t converted_value;
  Const *local_80;
  Const **local_78;
  size_type local_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *new_value_local;
  Const *this_local;
  
  local_18 = new_value;
  new_value_local = (string *)this;
  lVar1 = std::__cxx11::string::size();
  if (8 < (ulong)(lVar1 * 8)) {
    converted_value._6_1_ = 1;
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"string value too big to be converted to integer",&local_39);
    local_78 = &local_80;
    local_70 = 1;
    local_80 = this;
    std::allocator<const_kratos::IRNode_*>::allocator
              ((allocator<const_kratos::IRNode_*> *)((long)&converted_value + 7));
    __l._M_len = local_70;
    __l._M_array = (iterator)local_78;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_68,__l,(allocator<const_kratos::IRNode_*> *)((long)&converted_value + 7));
    VarException::VarException(this_00,&local_38,&local_68);
    converted_value._6_1_ = 0;
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  iVar2 = convert_string_to_int(local_18);
  (*(this->super_Var).super_IRNode._vptr_IRNode[0x2b])(this,iVar2);
  return;
}

Assistant:

void Const::set_value(const std::string &new_value) {
    // convert string to int
    if ((new_value.size() * 8) > sizeof(uint64_t)) {
        throw VarException("string value too big to be converted to integer", {this});
    }
    auto converted_value = convert_string_to_int(new_value);
    set_value(converted_value);
}